

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O2

QTextStream * operator<<(QTextStream *out,Rule *r)

{
  QTextStream *pQVar1;
  _List_node_base *p_Var2;
  
  pQVar1 = (QTextStream *)QTextStream::operator<<(out,(QString *)((r->lhs)._M_node + 1));
  QTextStream::operator<<(pQVar1," ::=");
  p_Var2 = (_List_node_base *)&r->rhs;
  while (p_Var2 = (((_List_base<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&r->rhs) {
    pQVar1 = (QTextStream *)QTextStream::operator<<(out," ");
    QTextStream::operator<<(pQVar1,(QString *)((long)p_Var2[1]._M_next + 0x10));
  }
  return out;
}

Assistant:

QTextStream &operator << (QTextStream &out, const Rule &r)
{
  out << *r.lhs << " ::=";

  for (NameList::const_iterator name = r.rhs.begin (); name != r.rhs.end (); ++name)
    out << " " << **name;

  return out;
}